

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  pointer ppAVar1;
  AnimationCurveNode *this_00;
  bool bVar2;
  AnimationCurveMap *pAVar3;
  mapped_type *this_01;
  Model *pMVar4;
  FBXConverter *pFVar5;
  char *__s;
  iterator iVar6;
  ImportSettings *pIVar7;
  mapped_type *pmVar8;
  aiNodeAnim *paVar9;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  TransformationComp TVar10;
  AnimationCurveNode *pAVar11;
  long lVar12;
  _Base_ptr p_Var13;
  uint uVar14;
  FBXConverter *pFVar15;
  FBXConverter *this_02;
  uint uVar16;
  Object *pOVar17;
  Object *pOVar18;
  pointer ppAVar19;
  bool bVar20;
  aiNodeAnim *na;
  FBXConverter *local_2b0;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *local_2a8;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *local_2a0;
  aiNodeAnim *inv;
  AnimationCurveNode *node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  undefined7 extraout_var;
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar19 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_2a8 = curves;
  local_2a0 = node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar1 == ppAVar19) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xae1,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar2 = this->doc->settings->strictMode;
  pOVar17 = (Object *)0x0;
  for (; ppAVar19 != ppAVar1; ppAVar19 = ppAVar19 + 1) {
    pAVar11 = *ppAVar19;
    pOVar18 = pAVar11->target;
    if ((pOVar17 != (Object *)0x0) && (bVar20 = pOVar18 != pOVar17, pOVar18 = pOVar17, bVar20)) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x51d78b);
    }
    if ((bVar2 != false) && (pAVar11->target != pOVar18)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xad0,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    pOVar17 = pOVar18;
  }
  ppAVar1 = (local_2a8->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pAVar11 = (AnimationCurveNode *)0x0;
  for (ppAVar19 = (local_2a8->
                  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppAVar19 != ppAVar1;
      ppAVar19 = ppAVar19 + 1) {
    this_00 = *ppAVar19;
    node = this_00;
    if (this_00 == (AnimationCurveNode *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xae8,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if ((this_00->prop)._M_string_length == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                     "target property for animation curve not set: ",&(this_00->super_Object).name);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
      std::__cxx11::string::~string((string *)chain);
    }
    else {
      pAVar3 = AnimationCurveNode::Curves_abi_cxx11_(this_00);
      pAVar11 = this_00;
      if ((pAVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "no animation curves assigned to AnimationCurveNode: ",
                       &(node->super_Object).name);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::__cxx11::string::~string((string *)chain);
      }
      else {
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  ::operator[](&node_property_map,&node->prop);
        std::
        vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
        ::push_back(this_01,&node);
      }
    }
  }
  if (pAVar11 == (AnimationCurveNode *)0x0) {
    __assert_fail("curve_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaf8,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pMVar4 = AnimationCurveNode::TargetAsModel(pAVar11);
  if (pMVar4 == (Model *)0x0) {
    __assert_fail("curve_node->TargetAsModel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaf9,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pFVar5 = (FBXConverter *)AnimationCurveNode::TargetAsModel(pAVar11);
  this_02 = (FBXConverter *)chain;
  bVar2 = false;
  pFVar15 = (FBXConverter *)0x0;
  memset(this_02,0,0x88);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &(pFVar5->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_2a8 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               *)0x0;
  local_2b0 = pFVar5;
  for (lVar12 = 0; lVar12 != 0x11; lVar12 = lVar12 + 1) {
    TVar10 = (TransformationComp)lVar12;
    if ((TVar10 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
        TransformationComp_RotationPivotInverse) {
      chain[lVar12]._M_node = &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      __s = NameTransformationCompProperty(this_02,TVar10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&nd,__s,(allocator<char> *)&node)
      ;
      pFVar15 = (FBXConverter *)&nd;
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
              ::find(&node_property_map._M_t,(key_type *)&nd);
      chain[lVar12]._M_node = iVar6._M_node;
      this_02 = (FBXConverter *)&nd;
      std::__cxx11::string::~string((string *)&nd);
      if ((_Rb_tree_header *)iVar6._M_node != &node_property_map._M_t._M_impl.super__Rb_tree_header)
      {
        pIVar7 = this->doc->settings;
        if (pIVar7->optimizeEmptyAnimationCurves == true) {
          pFVar15 = local_2b0;
          bVar20 = IsRedundantAnimationData
                             (this_02,(Model *)local_2b0,TVar10,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(iVar6._M_node + 2));
          pIVar7 = (ImportSettings *)CONCAT71(extraout_var,bVar20);
          if (bVar20) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &node,"dropping redundant animation channel for node ",local_270);
            pFVar15 = (FBXConverter *)&node;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
            LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
            this_02 = (FBXConverter *)&node;
            std::__cxx11::string::~string((string *)&node);
            goto LAB_0051d9e6;
          }
        }
        bVar2 = (bool)(bVar2 | ((TVar10 & (TransformationComp_GeometricScaling|
                                          TransformationComp_ScalingPivot)) !=
                                TransformationComp_Translation && lVar12 != 0xc));
        local_2a8 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                     *)CONCAT71((int7)((ulong)pIVar7 >> 8),1);
      }
    }
LAB_0051d9e6:
  }
  if (((ulong)local_2a8 & 1) == 0) {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x51dca4);
  }
  else if ((bVar2) ||
          (pFVar15 = local_2b0, bVar2 = NeedsComplexTransformationChain(this_02,(Model *)local_2b0),
          bVar2)) {
    uVar14 = 1;
    uVar16 = 0;
    for (lVar12 = 0; lVar12 != 0x11; lVar12 = lVar12 + 1) {
      p_Var13 = chain[lVar12]._M_node;
      if ((_Rb_tree_header *)p_Var13 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if (lVar12 == 0xd) {
          __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb4c,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (lVar12 == 9) {
          __assert_fail("comp != TransformationComp_RotationPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb4b,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        TVar10 = (TransformationComp)lVar12;
        NameTransformationChainNode((string *)&nd,pFVar15,fixed_name,TVar10);
        na = (aiNodeAnim *)0x0;
        if (TransformationComp_GeometricScaling < TVar10) {
LAB_0051df0f:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0xbb0,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        uVar16 = uVar16 | uVar14;
        if ((0x4c38U >>
             (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation)) &
            1) == 0) {
          if ((0x81c0U >>
               (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) {
            if ((0x11000U >>
                 (TVar10 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation
                           )) & 1) == 0) goto LAB_0051df0f;
            na = GenerateScalingNodeAnim
                           (this,(string *)&nd,extraout_RDX,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var13 + 2),layer_map,start,stop,max_time,min_time);
          }
          else {
            na = GenerateRotationNodeAnim
                           (this,(string *)&nd,(Model *)local_2b0,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var13 + 2),layer_map,start,stop,max_time,min_time);
LAB_0051dbc9:
            if (na == (aiNodeAnim *)0x0) {
              __assert_fail("na",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                            ,0xbb3,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
        }
        else {
          p_Var13 = p_Var13 + 2;
          pFVar15 = (FBXConverter *)&nd;
          na = GenerateTranslationNodeAnim
                         (this,(string *)&nd,extraout_RDX,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)p_Var13,layer_map,start,stop,max_time,min_time,false);
          if (lVar12 == 5) {
            NameTransformationChainNode
                      ((string *)&node,pFVar15,fixed_name,TransformationComp_RotationPivotInverse);
            paVar9 = GenerateTranslationNodeAnim
                               (this,(string *)&node,extraout_RDX_00,
                                (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                 *)p_Var13,layer_map,start,stop,max_time,min_time,true);
            inv = paVar9;
            if (((paVar9->mNumPositionKeys == 0) && (paVar9->mNumRotationKeys == 0)) &&
               (paVar9->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar9);
              operator_delete(paVar9,0x438);
            }
            else {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(local_2a0,&inv);
            }
            uVar16 = uVar16 | uVar14 << 4;
            std::__cxx11::string::~string((string *)&node);
            goto LAB_0051dbc9;
          }
          if (lVar12 == 0xb) {
            NameTransformationChainNode
                      ((string *)&node,pFVar15,fixed_name,TransformationComp_ScalingPivotInverse);
            paVar9 = GenerateTranslationNodeAnim
                               (this,(string *)&node,extraout_RDX_01,
                                (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                 *)p_Var13,layer_map,start,stop,max_time,min_time,true);
            inv = paVar9;
            if (((paVar9->mNumPositionKeys == 0) && (paVar9->mNumRotationKeys == 0)) &&
               (paVar9->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar9);
              operator_delete(paVar9,0x438);
            }
            else {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(local_2a0,&inv);
            }
            __assert_fail("TransformationComp_RotationPivotInverse > i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb9d,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
        }
        paVar9 = na;
        if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
           (na->mNumScalingKeys == 0)) {
          aiNodeAnim::~aiNodeAnim(na);
          pFVar15 = (FBXConverter *)0x438;
          operator_delete(paVar9,0x438);
        }
        else {
          pFVar15 = (FBXConverter *)&na;
          std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                    (local_2a0,(value_type *)pFVar15);
        }
        std::__cxx11::string::~string((string *)&nd);
      }
      uVar14 = uVar14 * 2;
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->node_anim_chain_bits,fixed_name);
    *pmVar8 = uVar16;
  }
  else {
    paVar9 = GenerateSimpleNodeAnim
                       (this,fixed_name,(Model *)local_2b0,chain,
                        (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                        layer_map,start,stop,max_time,min_time,true);
    nd = paVar9;
    if (paVar9 == (aiNodeAnim *)0x0) {
      __assert_fail("nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xb35,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if (((paVar9->mNumPositionKeys == 0) && (paVar9->mNumRotationKeys == 0)) &&
       (paVar9->mNumScalingKeys == 0)) {
      aiNodeAnim::~aiNodeAnim(paVar9);
      operator_delete(paVar9,0x438);
    }
    else {
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(local_2a0,&nd);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = nullptr;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }